

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureShadowTests.cpp
# Opt level: O2

void vkt::texture::anon_unknown_0::clampFloatingPointTexture(PixelBufferAccess *access)

{
  int z;
  int z_00;
  int y;
  int y_00;
  int x;
  int x_00;
  float fVar1;
  float fVar2;
  
  for (z_00 = 0; z_00 < (access->super_ConstPixelBufferAccess).m_size.m_data[2]; z_00 = z_00 + 1) {
    for (y_00 = 0; y_00 < (access->super_ConstPixelBufferAccess).m_size.m_data[1]; y_00 = y_00 + 1)
    {
      for (x_00 = 0; x_00 < (access->super_ConstPixelBufferAccess).m_size.m_data[0]; x_00 = x_00 + 1
          ) {
        fVar1 = tcu::ConstPixelBufferAccess::getPixDepth
                          (&access->super_ConstPixelBufferAccess,x_00,y_00,z_00);
        fVar2 = 1.0;
        if (fVar1 <= 1.0) {
          fVar2 = fVar1;
        }
        tcu::PixelBufferAccess::setPixDepth
                  (access,(float)(~-(uint)(fVar1 < 0.0) & (uint)fVar2),x_00,y_00,z_00);
      }
    }
  }
  return;
}

Assistant:

void clampFloatingPointTexture (const tcu::PixelBufferAccess& access)
{
	DE_ASSERT(isFloatingPointDepthFormat(access.getFormat()));

	for (int z = 0; z < access.getDepth(); ++z)
	for (int y = 0; y < access.getHeight(); ++y)
	for (int x = 0; x < access.getWidth(); ++x)
		access.setPixDepth(de::clamp(access.getPixDepth(x, y, z), 0.0f, 1.0f), x, y, z);
}